

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_ntlm.c
# Opt level: O2

CURLcode Curl_input_ntlm(connectdata *conn,_Bool proxy,char *header)

{
  uchar *puVar1;
  long lVar2;
  int iVar3;
  CURLcode CVar4;
  undefined7 in_register_00000031;
  byte *type2msg;
  
  iVar3 = curl_strnequal("NTLM",header,4);
  if (iVar3 == 0) {
    return CURLE_OK;
  }
  lVar2 = (CONCAT71(in_register_00000031,proxy) & 0xffffffff) * 4;
  for (type2msg = (byte *)(header + 4); *type2msg != 0; type2msg = type2msg + 1) {
    iVar3 = Curl_isspace((uint)*type2msg);
    if (iVar3 == 0) {
      if (*type2msg != 0) {
        CVar4 = Curl_auth_decode_ntlm_type2_message
                          (conn->data,(char *)type2msg,
                           (ntlmdata *)
                           ((conn->ntlm).nonce +
                           ((ulong)(uint)((int)CONCAT71(in_register_00000031,proxy) << 5) - 4)));
        if (CVar4 != CURLE_OK) {
          return CVar4;
        }
        puVar1 = (conn->ntlm).nonce + lVar2 + -0xc;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        goto LAB_00136b53;
      }
      break;
    }
  }
  iVar3 = *(int *)((conn->ntlm).nonce + lVar2 + -0xc);
  if (iVar3 == 0) {
LAB_00136b4b:
    puVar1 = (conn->ntlm).nonce + lVar2 + -0xc;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
LAB_00136b53:
    CVar4 = CURLE_OK;
  }
  else {
    if (iVar3 == 3) {
      Curl_infof(conn->data,"NTLM handshake rejected\n");
      Curl_http_auth_cleanup_ntlm(conn);
      puVar1 = (conn->ntlm).nonce + lVar2 + -0xc;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
    }
    else {
      if (iVar3 == 4) {
        Curl_infof(conn->data,"NTLM auth restarted\n");
        Curl_http_auth_cleanup_ntlm(conn);
        goto LAB_00136b4b;
      }
      Curl_infof(conn->data,"NTLM handshake failure (internal error)\n");
    }
    CVar4 = CURLE_REMOTE_ACCESS_DENIED;
  }
  return CVar4;
}

Assistant:

CURLcode Curl_input_ntlm(struct connectdata *conn,
                         bool proxy,         /* if proxy or not */
                         const char *header) /* rest of the www-authenticate:
                                                header */
{
  /* point to the correct struct with this */
  struct ntlmdata *ntlm;
  curlntlm *state;
  CURLcode result = CURLE_OK;

  ntlm = proxy ? &conn->proxyntlm : &conn->ntlm;
  state = proxy ? &conn->proxy_ntlm_state : &conn->http_ntlm_state;

  if(checkprefix("NTLM", header)) {
    header += strlen("NTLM");

    while(*header && ISSPACE(*header))
      header++;

    if(*header) {
      result = Curl_auth_decode_ntlm_type2_message(conn->data, header, ntlm);
      if(result)
        return result;

      *state = NTLMSTATE_TYPE2; /* We got a type-2 message */
    }
    else {
      if(*state == NTLMSTATE_LAST) {
        infof(conn->data, "NTLM auth restarted\n");
        Curl_http_auth_cleanup_ntlm(conn);
      }
      else if(*state == NTLMSTATE_TYPE3) {
        infof(conn->data, "NTLM handshake rejected\n");
        Curl_http_auth_cleanup_ntlm(conn);
        *state = NTLMSTATE_NONE;
        return CURLE_REMOTE_ACCESS_DENIED;
      }
      else if(*state >= NTLMSTATE_TYPE1) {
        infof(conn->data, "NTLM handshake failure (internal error)\n");
        return CURLE_REMOTE_ACCESS_DENIED;
      }

      *state = NTLMSTATE_TYPE1; /* We should send away a type-1 */
    }
  }

  return result;
}